

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ImFontAtlas(ImFontAtlas *this)

{
  int local_30;
  ImVec2 IStack_2c;
  int n;
  ImVec2 local_24 [2];
  ImFontAtlas *local_10;
  ImFontAtlas *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->TexUvScale);
  ImVec2::ImVec2(&this->TexUvWhitePixel);
  ImVector<ImFont_*>::ImVector(&this->Fonts);
  ImVector<ImFontAtlas::CustomRect>::ImVector(&this->CustomRects);
  ImVector<ImFontConfig>::ImVector(&this->ConfigData);
  this->Locked = false;
  this->Flags = 0;
  this->TexID = (ImTextureID)0x0;
  this->TexDesiredWidth = 0;
  this->TexGlyphPadding = 1;
  this->TexPixelsAlpha8 = (uchar *)0x0;
  this->TexPixelsRGBA32 = (uint *)0x0;
  this->TexHeight = 0;
  this->TexWidth = 0;
  ImVec2::ImVec2(local_24,0.0,0.0);
  this->TexUvScale = local_24[0];
  ImVec2::ImVec2(&stack0xffffffffffffffd4,0.0,0.0);
  this->TexUvWhitePixel = IStack_2c;
  for (local_30 = 0; local_30 < 1; local_30 = local_30 + 1) {
    this->CustomRectIds[local_30] = -1;
  }
  return;
}

Assistant:

ImFontAtlas::ImFontAtlas()
{
    Locked = false;
    Flags = ImFontAtlasFlags_None;
    TexID = (ImTextureID)NULL;
    TexDesiredWidth = 0;
    TexGlyphPadding = 1;

    TexPixelsAlpha8 = NULL;
    TexPixelsRGBA32 = NULL;
    TexWidth = TexHeight = 0;
    TexUvScale = ImVec2(0.0f, 0.0f);
    TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    for (int n = 0; n < IM_ARRAYSIZE(CustomRectIds); n++)
        CustomRectIds[n] = -1;
}